

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase
          (DescriptorPool *this,StringPiece name)

{
  StringPiece name_00;
  bool bVar1;
  uint uVar2;
  pointer pTVar3;
  size_type sVar4;
  string *str;
  FileDescriptor *pFVar5;
  bool bVar6;
  StringPiece local_158;
  DescriptorPool *local_148;
  char *pcStack_140;
  undefined1 local_130 [8];
  FileDescriptorProto file_proto;
  undefined1 local_48 [8];
  string name_string;
  DescriptorPool *this_local;
  StringPiece name_local;
  
  name_local.ptr_ = (char *)name.length_;
  this_local = (DescriptorPool *)name.ptr_;
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    name_local.length_._7_1_ = 0;
  }
  else {
    name_string.field_2._8_8_ = this;
    stringpiece_internal::StringPiece::operator_cast_to_string
              ((string *)local_48,(StringPiece *)&this_local);
    pTVar3 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    sVar4 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&pTVar3->known_bad_symbols_,(string *)local_48);
    if (sVar4 == 0) {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_130);
      local_148 = this_local;
      pcStack_140 = name_local.ptr_;
      name_00.length_ = (size_type)name_local.ptr_;
      name_00.ptr_ = (char *)this_local;
      bVar1 = IsSubSymbolOfBuiltType(this,name_00);
      bVar6 = true;
      if (!bVar1) {
        uVar2 = (*this->fallback_database_->_vptr_DescriptorDatabase[3])
                          (this->fallback_database_,local_48,local_130);
        bVar6 = true;
        if ((uVar2 & 1) != 0) {
          pTVar3 = std::
                   unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ::operator->(&this->tables_);
          str = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_130);
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_158,str);
          pFVar5 = Tables::FindFile(pTVar3,local_158);
          bVar6 = true;
          if (pFVar5 == (FileDescriptor *)0x0) {
            pFVar5 = BuildFileFromDatabase(this,(FileDescriptorProto *)local_130);
            bVar6 = pFVar5 == (FileDescriptor *)0x0;
          }
        }
      }
      if (bVar6) {
        pTVar3 = std::
                 unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ::operator->(&this->tables_);
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&pTVar3->known_bad_symbols_,(value_type *)local_48);
      }
      name_local.length_._7_1_ = !bVar6;
      file_proto.source_code_info_._0_4_ = 1;
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_130);
    }
    else {
      name_local.length_._7_1_ = 0;
      file_proto.source_code_info_._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return (bool)(name_local.length_._7_1_ & 1);
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(
    StringPiece name) const {
  if (fallback_database_ == nullptr) return false;

  auto name_string = std::string(name);
  if (tables_->known_bad_symbols_.count(name_string) > 0) return false;

  FileDescriptorProto file_proto;
  if (  // We skip looking in the fallback database if the name is a sub-symbol
        // of any descriptor that already exists in the descriptor pool (except
        // for package descriptors).  This is valid because all symbols except
        // for packages are defined in a single file, so if the symbol exists
        // then we should already have its definition.
        //
        // The other reason to do this is to support "overriding" type
        // definitions by merging two databases that define the same type. (Yes,
        // people do this.)  The main difficulty with making this work is that
        // FindFileContainingSymbol() is allowed to return both false positives
        // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and
        // false negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
        // When two such databases are merged, looking up a non-existent
        // sub-symbol of a type that already exists in the descriptor pool can
        // result in an attempt to load multiple definitions of the same type.
        // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(name_string, &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != nullptr

      // Build the file.
      || BuildFileFromDatabase(file_proto) == nullptr) {
    tables_->known_bad_symbols_.insert(std::move(name_string));
    return false;
  }

  return true;
}